

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

void CLI::detail::remove_default_flag_values(string *flags)

{
  ulong __pos_00;
  pointer pcVar1;
  undefined8 in_RAX;
  void *pvVar2;
  size_type sVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  size_t __n;
  size_type __pos;
  size_type __pos_01;
  undefined8 uStack_28;
  
  __pos_01 = 0xffffffffffffffff;
  uStack_28 = in_RAX;
  if (2 < flags->_M_string_length) {
    pcVar1 = (flags->_M_dataplus)._M_p;
    pvVar2 = memchr(pcVar1 + 2,0x7b,flags->_M_string_length - 2);
    __pos_01 = -(ulong)(pvVar2 == (void *)0x0) | (long)pvVar2 - (long)pcVar1;
  }
  while (__pos_01 != 0xffffffffffffffff) {
    __pos_00 = __pos_01 + 1;
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(flags,"},",__pos_00,2);
    if ((sVar3 != 0xffffffffffffffff) && (pcVar1 = (flags->_M_dataplus)._M_p, pcVar1[sVar3] == '}'))
    {
      if (pcVar1 + flags->_M_string_length == pcVar1 + sVar3 + 1) {
        flags->_M_string_length = __pos_01;
        pcVar1[__pos_01] = '\0';
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_erase
                  (flags,__pos_01,(long)(pcVar1 + sVar3 + 1) - (long)(pcVar1 + __pos_01));
      }
    }
    __pos_01 = 0xffffffffffffffff;
    __n = flags->_M_string_length - __pos_00;
    if (__pos_00 <= flags->_M_string_length && __n != 0) {
      pcVar1 = (flags->_M_dataplus)._M_p;
      pvVar2 = memchr(pcVar1 + __pos_00,0x7b,__n);
      __pos_01 = -(ulong)(pvVar2 == (void *)0x0) | (long)pvVar2 - (long)pcVar1;
    }
  }
  _Var4._M_current = (flags->_M_dataplus)._M_p;
  uStack_28 = CONCAT17(0x21,(undefined7)uStack_28);
  _Var4 = ::std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (_Var4,_Var4._M_current + flags->_M_string_length,(char *)((long)&uStack_28 + 7)
                    );
  flags->_M_string_length = (long)_Var4._M_current - (long)(flags->_M_dataplus)._M_p;
  *_Var4._M_current = '\0';
  return;
}

Assistant:

CLI11_INLINE void remove_default_flag_values(std::string &flags) {
    auto loc = flags.find_first_of('{', 2);
    while(loc != std::string::npos) {
        auto finish = flags.find_first_of("},", loc + 1);
        if((finish != std::string::npos) && (flags[finish] == '}')) {
            flags.erase(flags.begin() + static_cast<std::ptrdiff_t>(loc),
                        flags.begin() + static_cast<std::ptrdiff_t>(finish) + 1);
        }
        loc = flags.find_first_of('{', loc + 1);
    }
    flags.erase(std::remove(flags.begin(), flags.end(), '!'), flags.end());
}